

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O1

void google::protobuf::internal::SerializeMessageTo<google::protobuf::io::CodedOutputStream>
               (MessageLite *msg,void *table_ptr,CodedOutputStream *output)

{
  uint *puVar1;
  int iVar2;
  undefined8 in_RAX;
  undefined4 extraout_var;
  uint8_t *base;
  undefined8 local_28;
  
  if (table_ptr == (void *)0x0) {
    local_28 = in_RAX;
    iVar2 = (*msg->_vptr_MessageLite[9])(msg);
    local_28 = CONCAT44(local_28._4_4_,iVar2);
    PrimitiveTypeHelper<13>::Serialize(&local_28,output);
    iVar2 = (*msg->_vptr_MessageLite[0xb])(msg,output->cur_,output);
    output->cur_ = (uint8_t *)CONCAT44(extraout_var,iVar2);
  }
  else {
    puVar1 = *(uint **)((long)table_ptr + 8);
    local_28 = CONCAT44(*(undefined4 *)((long)&msg->_vptr_MessageLite + (ulong)*puVar1),(int)in_RAX)
    ;
    PrimitiveTypeHelper<13>::Serialize((void *)((long)&local_28 + 4),output);
    SerializeInternal((uint8_t *)msg,(FieldMetadata *)(puVar1 + 6),*table_ptr + -1,output);
  }
  return;
}

Assistant:

void SerializeMessageTo(const MessageLite* msg, const void* table_ptr,
                        O* output) {
  const SerializationTable* table =
      static_cast<const SerializationTable*>(table_ptr);
  if (!table) {
    // Proto1
    WriteLengthTo(msg->GetCachedSize(), output);
    SerializeMessageNoTable(msg, output);
    return;
  }
  const FieldMetadata* field_table = table->field_table;
  const uint8_t* base = reinterpret_cast<const uint8_t*>(msg);
  int cached_size =
      *reinterpret_cast<const int32_t*>(base + field_table->offset);
  WriteLengthTo(cached_size, output);
  int num_fields = table->num_fields - 1;
  SerializeMessageDispatch(*msg, field_table + 1, num_fields, cached_size,
                           output);
}